

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_LookEx(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  int iVar1;
  bool bVar2;
  PClassActor *cls;
  FState *newstate;
  AActor *pAVar3;
  AActor *pAVar4;
  FSoundID *sound_id;
  AActor *this;
  FState *newstate_00;
  char *pcVar5;
  TObjPtr<AActor> *pTVar6;
  uint uVar7;
  double dVar8;
  float attenuation;
  double local_b0;
  double local_a8;
  void *local_a0;
  FSoundID local_94;
  FSoundID local_90;
  FName local_8c;
  double local_88;
  undefined8 uStack_80;
  FLookExParams params;
  NActorIterator iterator;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_004001cd;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004001bd:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004001cd:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x816,
                  "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003ffc1e;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004001cd;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_004001bd;
LAB_003ffc1e:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0040027a:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x817,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar7 = param[1].field_0.i;
LAB_003ffc75:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00400299:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x818,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_a0 = param[2].field_0.field_1.a;
LAB_003ffc8c:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00400249:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x819,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_a8 = param[3].field_0.f;
LAB_003ffca3:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0040022a:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81a,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_b0 = param[4].field_0.f;
LAB_003ffcb4:
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0040020b:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81b,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_88 = param[5].field_0.f;
LAB_003ffcca:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004001ec:
      uStack_80 = 0;
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81c,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0040027a;
    }
    uVar7 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003ffc75;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_00400299;
    }
    local_a0 = (void *)param[2].field_0.f;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ffc8c;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_00400249;
    }
    local_a8 = param[3].field_0.f;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003ffca3;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0040022a;
    }
    local_b0 = param[4].field_0.f;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ffcb4;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0040020b;
    }
    local_88 = param[5].field_0.f;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003ffcca;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_004001ec;
    }
  }
  uStack_80 = 0;
  iVar1 = param[6].field_0.i;
  cls = (PClassActor *)DObject::GetClass((DObject *)this);
  newstate = FStateLabelStorage::GetState(&StateLabels,iVar1,cls,false);
  params.Fov.Degrees =
       (double)(~-(ulong)(local_88 == 0.0) & (ulong)local_88 |
               (ulong)((uint)(-(ulong)(local_88 == 0.0) >> 0x20) & 0x40668000) << 0x20);
  params.minDist = (double)local_a0;
  params.maxDist = local_a8;
  params.maxHeardist = local_b0;
  if (((this->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  params.flags = uVar7;
  params.seestate = newstate;
  if ((this->special == 0xe5) && (this->args[0] == 0)) {
    iterator.super_FActorIterator.id = this->args[1];
    iterator.super_FActorIterator.base = (AActor *)0x0;
    local_8c.Index = 0x111;
    iterator.type = PClass::FindClass(&local_8c);
    this->special = 0;
    pAVar3 = NActorIterator::Next(&iterator);
    (this->goal).field_0.p = pAVar3;
    this->reactiontime = this->args[2] * 0x23 + level.maptime;
    (this->flags5).Value = (uint)(this->args[3] != 0) << 7 | (this->flags5).Value & 0xffffff7f;
  }
  this->threshold = 0;
  if (this->TIDtoHate == 0) {
    if ((uVar7 & 2) == 0) {
      if (((i_compatflags._1_1_ & 8) == 0) && (((this->flags).Value & 8) == 0)) {
        pTVar6 = &this->LastHeard;
      }
      else {
        pTVar6 = &this->Sector->SoundTarget;
      }
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)pTVar6);
      if ((pAVar3 != (AActor *)0x0) && (0 < pAVar3->health)) {
        dVar8 = AActor::Distance2D(this,pAVar3,false);
        if (((local_b0 == 0.0) && (!NAN(local_b0))) || (dVar8 <= local_b0)) {
          if ((pAVar3->player != (player_t *)0x0) && ((pAVar3->player->cheats & 8) != 0)) {
            return 0;
          }
          goto LAB_003ffed5;
        }
        (this->LastHeard).field_0.p = (AActor *)0x0;
      }
    }
    pAVar3 = (AActor *)0x0;
  }
  else {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->target);
  }
LAB_003ffed5:
  if (((this->flags).Value & 0x40000000) != 0) {
    this->visdir = -1;
  }
  if ((pAVar3 != (AActor *)0x0) && (((pAVar3->flags).Value & 4) != 0)) {
    bVar2 = AActor::IsFriend(this,pAVar3);
    if (bVar2) {
      if (((this->flags4).Value & 0x20000) == 0) {
        if (((uVar7 & 1) == 0) && (bVar2 = P_LookForPlayers(this,1,&params), bVar2))
        goto LAB_003fff1a;
        if (((this->flags).Value & 0x2000) == 0) {
          newstate_00 = newstate;
          if ((newstate == (FState *)0x0) &&
             (newstate_00 = this->SeeState, this->SeeState == (FState *)0x0)) {
            A_Wander(this,0);
          }
          else {
            AActor::SetState(this,newstate_00,false);
          }
        }
      }
    }
    else {
      pTVar6 = &this->target;
      (this->target).field_0.p = pAVar3;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)pTVar6);
      if (pAVar3 == this) {
        (pTVar6->field_0).p = (AActor *)0x0;
      }
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)pTVar6);
      if (pAVar3 != (AActor *)0x0) {
        if (((this->flags).Value & 0x20) == 0) goto LAB_003fff1a;
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)pTVar6);
        dVar8 = AActor::Distance2D(this,pAVar3,false);
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)pTVar6);
        bVar2 = P_CheckSight(this,pAVar3,4);
        if (((bVar2) &&
            ((((double)local_a0 == 0.0 && (!NAN((double)local_a0))) || ((double)local_a0 < dVar8))))
           && (((local_a8 == 0.0 && (!NAN(local_a8))) || (dVar8 < local_a8)))) goto LAB_003fff1a;
      }
    }
  }
  if ((uVar7 & 1) != 0) {
    return 0;
  }
  bVar2 = P_LookForPlayers(this,1,&params);
  if (!bVar2) {
    return 0;
  }
LAB_003fff1a:
  pTVar6 = &this->target;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->goal);
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)pTVar6);
  if (pAVar4 == pAVar3) {
    if (level.maptime < this->reactiontime) {
      (pTVar6->field_0).p = (AActor *)0x0;
    }
  }
  else {
    iVar1 = (this->SeeSound).super_FSoundID.ID;
    if ((iVar1 != 0) && ((uVar7 & 8) == 0)) {
      if ((uVar7 & 0x10) == 0) {
        sound_id = &local_94;
        attenuation = 1.0;
        local_94.ID = iVar1;
      }
      else {
        sound_id = &local_90;
        attenuation = 0.0;
        local_90.ID = iVar1;
      }
      S_Sound(this,2,sound_id,1.0,attenuation);
    }
  }
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)pTVar6);
  if ((pAVar3 != (AActor *)0x0) && ((uVar7 & 0x20) == 0 && ((this->flags).Value & 0x2000) == 0)) {
    if (newstate == (FState *)0x0) {
      newstate = this->SeeState;
    }
    AActor::SetState(this,newstate,false);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LookEx)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)			
	PARAM_FLOAT_DEF	(minseedist)	
	PARAM_FLOAT_DEF	(maxseedist)	
	PARAM_FLOAT_DEF (maxheardist)	
	PARAM_ANGLE_DEF (fov)			
	PARAM_STATE_DEF	(seestate)		

	AActor *targ = NULL; // Shuts up gcc
	double dist;
	if (fov == 0) fov = 180.;
	FLookExParams params = { fov, minseedist, maxseedist, maxheardist, flags, seestate };

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	// [RH] Set goal now if appropriate
	if (self->special == Thing_SetGoal && self->args[0] == 0) 
	{
		NActorIterator iterator(NAME_PatrolPoint, self->args[1]);
		self->special = 0;
		self->goal = iterator.Next ();
		self->reactiontime = self->args[2] * TICRATE + level.maptime;
		if (self->args[3] == 0)
			self->flags5 &= ~MF5_CHASEGOAL;
		else
			self->flags5 |= MF5_CHASEGOAL;
	}

	self->threshold = 0;		// any shot will wake up

	if (self->TIDtoHate != 0)
	{
		targ = self->target;
	}
	else
	{
		if (!(flags & LOF_NOSOUNDCHECK))
		{
			targ = (i_compatflags & COMPATF_SOUNDTARGET || self->flags & MF_NOSECTOR)?
				self->Sector->SoundTarget : self->LastHeard;
			if (targ != NULL)
			{
				// [RH] If the soundtarget is dead, don't chase it
				if (targ->health <= 0)
				{
					targ = NULL;
				}
				else
				{
					dist = self->Distance2D (targ);

					// [KS] If the target is too far away, don't respond to the sound.
					if (maxheardist && dist > maxheardist)
					{
						targ = NULL;
						self->LastHeard = NULL;
					}
				}
			}
        }
        
        if (targ && targ->player && (targ->player->cheats & CF_NOTARGET))
        {
            return 0;
        }
	}

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = -1;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if (self->IsFriend (targ))	// be a little more precise!
		{
			if (!(self->flags4 & MF4_STANDSTILL))
			{
				if (!(flags & LOF_NOSIGHTCHECK))
				{
					// If we find a valid target here, the wandering logic should *not*
					// be activated! If would cause the seestate to be set twice.
					if (P_LookForPlayers(self, true, &params))
						goto seeyou;
				}

				// Let the self wander around aimlessly looking for a fight
                if (!(self->flags & MF_INCHASE))
                {
                    if (seestate)
                    {
                        self->SetState (seestate);
                    }
                    else
                    {
                        if (self->SeeState != NULL)
                        {
                            self->SetState (self->SeeState);
                        }
                        else
                        {
                            A_Wander(self);
                        }
                    }
                }
			}
		}
		else
		{
			self->target = targ; //We already have a target?
            
            // [KS] The target can become ourselves in rare circumstances (like
            // if we committed suicide), so if that's the case, just ignore it.
            if (self->target == self) self->target = NULL;

			if (self->target != NULL)
			{
				if (self->flags & MF_AMBUSH)
				{
					dist = self->Distance2D (self->target);
					if (P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING) &&
						(!minseedist || dist > minseedist) &&
						(!maxseedist || dist < maxseedist))
					{
						goto seeyou;
					}
				}
				else
					goto seeyou;
			}
		}
	}

	if (!(flags & LOF_NOSIGHTCHECK))
	{
		if (!P_LookForPlayers(self, true, &params))
			return 0;
	}
	else
	{
		return 0;
	}
				
	// go into chase state
  seeyou:
	// [RH] Don't start chasing after a goal if it isn't time yet.
	if (self->target == self->goal)
	{
		if (self->reactiontime > level.maptime)
			self->target = NULL;
	}
	else if (self->SeeSound && !(flags & LOF_NOSEESOUND))
	{
		if (flags & LOF_FULLVOLSEESOUND)
		{ // full volume
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NORM);
		}
	}

	if (self->target && !(self->flags & MF_INCHASE))
	{
        if (!(flags & LOF_NOJUMP))
        {
            if (seestate)
            {
                self->SetState (seestate);
            }
            else
            {
                self->SetState (self->SeeState);
            }
        }
	}
	return 0;
}